

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ptrlen.c
# Opt level: O2

ptrlen ptrlen_get_word(ptrlen *input,char *separators)

{
  char *pcVar1;
  void *pvVar2;
  ulong uVar3;
  char *pcVar4;
  size_t sVar5;
  ulong uVar6;
  ulong uVar7;
  ptrlen pVar8;
  
  pvVar2 = input->ptr;
  uVar3 = input->len;
  for (uVar6 = 0; pcVar1 = (char *)((long)pvVar2 + uVar6), pcVar1 < (char *)((long)pvVar2 + uVar3);
      uVar6 = uVar6 + 1) {
    pcVar4 = strchr(separators,(int)*pcVar1);
    if (pcVar4 == (char *)0x0) break;
  }
  uVar7 = uVar6;
  for (sVar5 = 0; pcVar1 + sVar5 < (char *)((long)pvVar2 + uVar3); sVar5 = sVar5 + 1) {
    pcVar4 = strchr(separators,(int)*(char *)((long)pvVar2 + uVar6 + sVar5));
    if (pcVar4 != (char *)0x0) break;
    uVar7 = uVar7 + 1;
  }
  if (uVar7 <= uVar3) {
    input->ptr = pcVar1 + sVar5;
    input->len = uVar3 - uVar7;
    pVar8.len = sVar5;
    pVar8.ptr = pcVar1;
    return pVar8;
  }
  __assert_fail("to_consume <= input->len",
                "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/utils/ptrlen.c",
                0x56,"ptrlen ptrlen_get_word(ptrlen *, const char *)");
}

Assistant:

ptrlen ptrlen_get_word(ptrlen *input, const char *separators)
{
    const char *p = input->ptr, *end = p + input->len;
    ptrlen toret;

    while (p < end && strchr(separators, *p))
        p++;
    toret.ptr = p;
    while (p < end && !strchr(separators, *p))
        p++;
    toret.len = p - (const char *)toret.ptr;

    size_t to_consume = p - (const char *)input->ptr;
    assert(to_consume <= input->len);
    input->ptr = (const char *)input->ptr + to_consume;
    input->len -= to_consume;

    return toret;
}